

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O2

boolean mb_trapped(monst *mtmp)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  
  if (flags.verbose != '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (flags.soundok != '\0') {
        You_hear("a distant explosion.");
      }
    }
    else {
      pline("KABOOM!!  You see a door explode.");
    }
  }
  wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
  mtmp->field_0x62 = mtmp->field_0x62 | 0x10;
  iVar4 = rnd(0xf);
  piVar1 = &mtmp->mhp;
  iVar2 = *piVar1;
  *piVar1 = *piVar1 - iVar4;
  if (*piVar1 == 0 || SBORROW4(iVar2,iVar4) != *piVar1 < 0) {
    mondied(mtmp);
    bVar3 = mtmp->mhp < 1;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

boolean mb_trapped(struct monst *mtmp)
{
	if (flags.verbose) {
	    if (cansee(mtmp->mx, mtmp->my))
		pline("KABOOM!!  You see a door explode.");
	    else if (flags.soundok)
		You_hear("a distant explosion.");
	}
	wake_nearto(mtmp->mx, mtmp->my, 7*7);
	mtmp->mstun = 1;
	mtmp->mhp -= rnd(15);
	if (mtmp->mhp <= 0) {
		mondied(mtmp);
		if (mtmp->mhp > 0) /* lifesaved */
			return FALSE;
		else
			return TRUE;
	}
	return FALSE;
}